

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_equal_to_double_constraint(double expected_value,char *expected_value_name)

{
  CgreenValue expected_value_00;
  Constraint *pCVar1;
  double in_XMM0_Qa;
  Constraint *constraint;
  undefined8 in_stack_ffffffffffffffd0;
  anon_union_8_4_d526cc82_for_value in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  make_cgreen_double_value((CgreenValue *)&stack0xffffffffffffffd0,in_XMM0_Qa);
  expected_value_00.value.integer_value = in_stack_ffffffffffffffd8.integer_value;
  expected_value_00.type = (CgreenValueType)in_stack_ffffffffffffffd0;
  expected_value_00._4_4_ = SUB84(in_stack_ffffffffffffffd0,4);
  expected_value_00.value_size = in_stack_ffffffffffffffe0;
  pCVar1 = create_constraint_expecting(expected_value_00,in_stack_ffffffffffffffd8.string_value);
  pCVar1->type = CGREEN_DOUBLE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_double;
  pCVar1->execute = test_want_double;
  pCVar1->name = "equal double";
  pCVar1->destroy = destroy_double_constraint;
  return pCVar1;
}

Assistant:

Constraint *create_equal_to_double_constraint(double expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_double_value(expected_value), expected_value_name);
    constraint->type = CGREEN_DOUBLE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_double;
    constraint->execute = &test_want_double;
    constraint->name = "equal double";
    constraint->destroy = &destroy_double_constraint;

    return constraint;
}